

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arbitrary.cpp
# Opt level: O0

void __thiscall Arbitraryforward_list::~Arbitraryforward_list(Arbitraryforward_list *this)

{
  Arbitraryforward_list *this_local;
  
  ~Arbitraryforward_list(this);
  operator_delete(this,0x40);
  return;
}

Assistant:

DEF_TEST(forward_list, Arbitrary)
{
  testinator::Arbitrary<forward_list<int>> a;
  forward_list<int> v = a.generate(1,0);
  vector<forward_list<int>> vv = a.shrink(v);

  std::size_t vlen = 0;
  for (auto it = v.begin(); it != v.end(); ++it, ++vlen);

  std::size_t vv0len = 0;
  std::size_t vv1len = 0;
  if (vv.size() > 0)
    for (auto it = vv[0].begin(); it != vv[0].end(); ++it, ++vv0len);
  if (vv.size() > 1)
    for (auto it = vv[1].begin(); it != vv[1].end(); ++it, ++vv1len);

  return vv.size() == 2
    && vv0len + vv1len == vlen;
}